

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__stream_flush_write_queue(uv_stream_t *stream,int error)

{
  long *plVar1;
  QUEUE *q;
  uv_write_t *req;
  int error_local;
  uv_stream_t *stream_local;
  
  while (stream->write_queue != (void **)stream->write_queue[0]) {
    plVar1 = (long *)stream->write_queue[0];
    *(long *)plVar1[1] = *plVar1;
    *(long *)(*plVar1 + 8) = plVar1[1];
    *(int *)((long)plVar1 + 0x24) = error;
    *plVar1 = (long)stream->write_completed_queue;
    plVar1[1] = (long)stream->write_completed_queue[1];
    *(long **)plVar1[1] = plVar1;
    stream->write_completed_queue[1] = plVar1;
  }
  return;
}

Assistant:

void uv__stream_flush_write_queue(uv_stream_t* stream, int error) {
  uv_write_t* req;
  QUEUE* q;
  while (!QUEUE_EMPTY(&stream->write_queue)) {
    q = QUEUE_HEAD(&stream->write_queue);
    QUEUE_REMOVE(q);

    req = QUEUE_DATA(q, uv_write_t, queue);
    req->error = error;

    QUEUE_INSERT_TAIL(&stream->write_completed_queue, &req->queue);
  }
}